

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O1

TidyMessageImpl *
tidyMessageCreateInitV
          (TidyDocImpl *doc,Node *node,uint code,int line,int column,TidyReportLevel level,
          __va_list_tag *args)

{
  printfArg *ppVar1;
  tidyStrings *ptVar2;
  TidyReportLevel messageType;
  TidyDocImpl *pTVar3;
  int iVar4;
  uint uVar5;
  Bool BVar6;
  Bool BVar7;
  TidyMessageImpl *pTVar8;
  byte *pbVar9;
  printfArg *ppVar10;
  size_t sVar11;
  ctmbstr ptVar12;
  tmbstr ptVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  anon_union_8_4_c3534ca5_for_u *paVar17;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  byte *pbVar21;
  byte *pbVar22;
  char *format;
  TidyDoc tdoc;
  long lVar23;
  va_list args_copy;
  __va_list_tag local_68;
  uint local_4c;
  uint local_48;
  TidyReportLevel local_44;
  byte *local_40;
  TidyDocImpl *local_38;
  
  pTVar8 = (TidyMessageImpl *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x90);
  pTVar8->tidyDoc = doc;
  pTVar8->tidyNode = node;
  pTVar8->code = code;
  pTVar8->line = line;
  pTVar8->column = column;
  pTVar8->level = level;
  pTVar8->muted = no;
  ptVar2 = (doc->muted).list;
  if (ptVar2 != (tidyStrings *)0x0) {
    uVar15 = 0;
    do {
      if (ptVar2[uVar15] == 0) break;
      if (ptVar2[uVar15] == code) {
        pTVar8->muted = yes;
        break;
      }
      uVar15 = uVar15 + 1;
    } while (ptVar2 != (tidyStrings *)0x0);
  }
  local_68.reg_save_area = args->reg_save_area;
  local_68.gp_offset = args->gp_offset;
  local_68.fp_offset = args->fp_offset;
  local_68.overflow_arg_area = args->overflow_arg_area;
  local_4c = line;
  local_44 = level;
  pbVar9 = (byte *)tidyDefaultString(code);
  pTVar8->argcount = 0;
  uVar15 = 0;
  pbVar22 = pbVar9;
LAB_0015b8f2:
  pbVar22 = pbVar22 + 1;
LAB_0015b8f5:
  pbVar21 = pbVar22;
  if (pbVar21[-1] != 0) goto code_r0x0015b8fd;
  local_38 = doc;
  if (uVar15 == 0) goto LAB_0015bb66;
  local_48 = uVar15;
  local_40 = pbVar9;
  ppVar10 = (printfArg *)(*doc->allocator->vtbl->alloc)(doc->allocator,(ulong)uVar15 * 0x30);
  if (ppVar10 == (printfArg *)0x0) {
    pTVar8->argcount = -1;
    goto LAB_0015bb66;
  }
  sVar11 = 0;
  do {
    pcVar20 = ppVar10->format + (sVar11 - 0xc);
    pcVar20[0] = '\x14';
    pcVar20[1] = '\0';
    pcVar20[2] = '\0';
    pcVar20[3] = '\0';
    sVar11 = sVar11 + 0x30;
  } while ((ulong)uVar15 * 0x30 != sVar11);
  lVar23 = -1;
  pbVar22 = local_40;
LAB_0015b973:
  do {
    while (bVar14 = *pbVar22, bVar14 != 0x25) {
      pbVar22 = pbVar22 + 1;
      if (bVar14 == 0) goto LAB_0015bb42;
    }
    bVar14 = pbVar22[1];
    pbVar9 = pbVar22 + 2;
    pbVar22 = pbVar9;
  } while (bVar14 == 0x25);
  if (bVar14 == 0x2a) goto LAB_0015bb3b;
  while ((byte)(bVar14 - 0x30) < 10) {
    bVar14 = *pbVar22;
    pbVar22 = pbVar22 + 1;
  }
  if (bVar14 == 0x2e) {
    bVar14 = *pbVar22;
    if (bVar14 == 0x2a) goto LAB_0015bb3b;
    while (pbVar22 = pbVar22 + 1, (byte)(bVar14 - 0x30) < 10) {
      bVar14 = *pbVar22;
    }
  }
  lVar23 = lVar23 + 1;
  ppVar1 = ppVar10 + lVar23;
  ppVar10[lVar23].type = tidyFormatType_UINT;
  switch(bVar14) {
  case 99:
  case 0x6f:
  case 0x75:
  case 0x78:
    goto switchD_0015ba16_caseD_63;
  case 100:
  case 0x69:
    ppVar1->type = tidyFormatType_INT;
    goto switchD_0015ba16_caseD_63;
  case 0x65:
  case 0x66:
  case 0x67:
switchD_0015ba16_caseD_65:
    ppVar1->type = tidyFormatType_DOUBLE;
    uVar19 = (ulong)local_68.fp_offset;
    if (uVar19 < 0xa1) {
      local_68.fp_offset = local_68.fp_offset + 0x10;
      paVar17 = (anon_union_8_4_c3534ca5_for_u *)(uVar19 + (long)local_68.reg_save_area);
    }
    else {
      paVar17 = (anon_union_8_4_c3534ca5_for_u *)local_68.overflow_arg_area;
      local_68.overflow_arg_area =
           (anon_union_8_4_c3534ca5_for_u *)((long)local_68.overflow_arg_area + 8);
    }
    ppVar1->u = *paVar17;
    break;
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
switchD_0015ba16_caseD_68:
    ppVar1->type = tidyFormatType_UNKNOWN;
    pTVar8->argcount = -1;
    break;
  case 0x73:
    ppVar1->type = tidyFormatType_STRING;
    uVar19 = local_68._0_8_ & 0xffffffff;
    if (uVar19 < 0x29) {
      local_68.gp_offset = local_68.gp_offset + 8;
      paVar17 = (anon_union_8_4_c3534ca5_for_u *)(uVar19 + (long)local_68.reg_save_area);
    }
    else {
      paVar17 = (anon_union_8_4_c3534ca5_for_u *)local_68.overflow_arg_area;
      local_68.overflow_arg_area =
           (anon_union_8_4_c3534ca5_for_u *)((long)local_68.overflow_arg_area + 8);
    }
    ppVar1->u = *paVar17;
    break;
  default:
    if (bVar14 - 0x45 < 3) goto switchD_0015ba16_caseD_65;
    if (bVar14 != 0x58) goto switchD_0015ba16_caseD_68;
switchD_0015ba16_caseD_63:
    uVar19 = local_68._0_8_ & 0xffffffff;
    if (uVar19 < 0x29) {
      local_68.gp_offset = local_68.gp_offset + 8;
      paVar17 = (anon_union_8_4_c3534ca5_for_u *)(uVar19 + (long)local_68.reg_save_area);
    }
    else {
      paVar17 = (anon_union_8_4_c3534ca5_for_u *)local_68.overflow_arg_area;
      local_68.overflow_arg_area =
           (anon_union_8_4_c3534ca5_for_u *)((long)local_68.overflow_arg_area + 8);
    }
    (ppVar1->u).i = paVar17->i;
  }
  iVar4 = ((int)pbVar9 - (int)local_40) + -2;
  ppVar1->formatStart = iVar4;
  iVar16 = (int)pbVar22 - (iVar4 + (int)local_40);
  ppVar1->formatLength = iVar16;
  if (iVar16 < 0x15) {
    strncpy(ppVar1->format,(char *)(local_40 + iVar4),(long)iVar16);
    ppVar1->format[iVar16] = '\0';
    if (ppVar1->type != tidyFormatType_UNKNOWN) goto LAB_0015b973;
  }
LAB_0015bb3b:
  pTVar8->argcount = -1;
LAB_0015bb42:
  if (pTVar8->argcount < 0) {
    (*local_38->allocator->vtbl->free)(local_38->allocator,ppVar10);
LAB_0015bb66:
    ppVar10 = (printfArg *)0x0;
  }
  else {
    pTVar8->argcount = local_48;
  }
  pTVar8->arguments = ppVar10;
  ptVar12 = prvTidytidyErrorCodeAsKey(code);
  pTVar8->messageKey = ptVar12;
  ptVar12 = tidyDefaultString(code);
  pTVar8->messageFormatDefault = ptVar12;
  ptVar12 = tidyLocalizedString(code);
  pTVar3 = local_38;
  pTVar8->messageFormat = ptVar12;
  ptVar13 = (tmbstr)(*local_38->allocator->vtbl->alloc)(local_38->allocator,0x800);
  pTVar8->messageDefault = ptVar13;
  local_68.gp_offset = args->gp_offset;
  local_68.fp_offset = args->fp_offset;
  local_68.overflow_arg_area = args->overflow_arg_area;
  local_68.reg_save_area = args->reg_save_area;
  prvTidytmbvsnprintf(pTVar8->messageDefault,0x800,pTVar8->messageFormatDefault,&local_68);
  ptVar13 = (tmbstr)(*pTVar3->allocator->vtbl->alloc)(pTVar3->allocator,0x800);
  pTVar8->message = ptVar13;
  local_68.gp_offset = args->gp_offset;
  local_68.fp_offset = args->fp_offset;
  local_68.overflow_arg_area = args->overflow_arg_area;
  local_68.reg_save_area = args->reg_save_area;
  prvTidytmbvsnprintf(pTVar8->message,0x800,pTVar8->messageFormat,&local_68);
  ptVar13 = (tmbstr)(*pTVar3->allocator->vtbl->alloc)(pTVar3->allocator,0x800);
  pTVar8->messagePosDefault = ptVar13;
  ptVar13 = (tmbstr)(*pTVar3->allocator->vtbl->alloc)(pTVar3->allocator,0x800);
  uVar15 = local_4c;
  pTVar8->messagePos = ptVar13;
  if ((*(int *)((pTVar3->config).value + 0x13) == 0) ||
     (uVar18 = (pTVar3->config).value[0x14].v, uVar18 == 0)) {
    if ((*(int *)((pTVar3->config).value + 0x4a) == 0) || ((pTVar3->config).value[0x14].v == 0)) {
      ptVar13 = pTVar8->messagePosDefault;
      ptVar12 = tidyDefaultString(0x1f5);
      prvTidytmbsnprintf(ptVar13,0x800,ptVar12,(ulong)uVar15,(ulong)(uint)column);
      ptVar13 = pTVar8->messagePos;
      ptVar12 = tidyLocalizedString(0x1f5);
      prvTidytmbsnprintf(ptVar13,0x800,ptVar12,(ulong)uVar15,(ulong)(uint)column);
      goto LAB_0015bd68;
    }
    ptVar13 = pTVar8->messagePosDefault;
    ptVar12 = tidyDefaultString(0x1f6);
    prvTidytmbsnprintf(ptVar13,0x800,ptVar12,(pTVar3->config).value[0x14].v,(ulong)uVar15,
                       (ulong)(uint)column);
    ptVar13 = pTVar8->messagePos;
    pcVar20 = tidyLocalizedString(0x1f6);
    uVar18 = (pTVar3->config).value[0x14].v;
  }
  else {
    prvTidytmbsnprintf(pTVar8->messagePosDefault,0x800,"%s:%d:%d: ",uVar18,(ulong)local_4c,
                       (ulong)(uint)column);
    ptVar13 = pTVar8->messagePos;
    uVar18 = (pTVar3->config).value[0x14].v;
    pcVar20 = "%s:%d:%d: ";
  }
  prvTidytmbsnprintf(ptVar13,0x800,pcVar20,uVar18,(ulong)uVar15,(ulong)(uint)column);
LAB_0015bd68:
  messageType = local_44;
  ptVar12 = tidyDefaultString(local_44);
  pTVar8->messagePrefixDefault = ptVar12;
  ptVar12 = tidyLocalizedString(messageType);
  pTVar8->messagePrefix = ptVar12;
  pcVar20 = "%s%s%s";
  if (column < 1) {
    pcVar20 = "%.0s%s%s";
  }
  if ((int)uVar15 < 1) {
    pcVar20 = "%.0s%s%s";
  }
  format = "%.0s%.0s%s";
  if (messageType < TidyDialogueSummary) {
    format = pcVar20;
  }
  ptVar13 = (tmbstr)(*pTVar3->allocator->vtbl->alloc)(pTVar3->allocator,0x800);
  pTVar8->messageOutputDefault = ptVar13;
  prvTidytmbsnprintf(ptVar13,0x800,format,pTVar8->messagePosDefault,pTVar8->messagePrefixDefault,
                     pTVar8->messageDefault);
  ptVar13 = (tmbstr)(*pTVar3->allocator->vtbl->alloc)(pTVar3->allocator,0x800);
  pTVar8->messageOutput = ptVar13;
  prvTidytmbsnprintf(ptVar13,0x800,format,pTVar8->messagePos,pTVar8->messagePrefix,pTVar8->message);
  if ((messageType < TidyDialogueSummary) && (*(int *)((pTVar3->config).value + 0x37) == 1)) {
    ptVar12 = prvTidytidyErrorCodeAsKey(code);
    uVar5 = prvTidytmbstrlen(pTVar8->messageOutputDefault);
    if (uVar5 < 0x800) {
      prvTidytmbsnprintf(pTVar8->messageOutputDefault + uVar5,(ulong)(0x800 - uVar5)," (%s)",ptVar12
                        );
    }
    uVar5 = prvTidytmbstrlen(pTVar8->messageOutput);
    if (uVar5 < 0x800) {
      prvTidytmbsnprintf(pTVar8->messageOutput + uVar5,(ulong)(0x800 - uVar5)," (%s)",ptVar12);
    }
  }
  pTVar8->allowMessage = yes;
  if ((pTVar8->level < TidyDialogueSummary) && (pTVar3->reportFilter != (TidyReportFilter)0x0)) {
    BVar6 = (*pTVar3->reportFilter)
                      ((TidyDoc)pTVar3,pTVar8->level,pTVar8->line,pTVar8->column,
                       pTVar8->messageOutput);
    pTVar8->allowMessage = BVar6 & yes;
  }
  if ((pTVar8->level < TidyDialogueSummary) && (pTVar3->reportCallback != (TidyReportCallback)0x0))
  {
    local_68.reg_save_area = args->reg_save_area;
    local_68.gp_offset = args->gp_offset;
    local_68.fp_offset = args->fp_offset;
    local_68.overflow_arg_area = args->overflow_arg_area;
    BVar6 = pTVar8->allowMessage;
    BVar7 = (*pTVar3->reportCallback)
                      ((TidyDoc)pTVar3,pTVar8->level,pTVar8->line,pTVar8->column,pTVar8->messageKey,
                       &local_68);
    pTVar8->allowMessage = BVar7 & BVar6;
  }
  if (pTVar3->messageCallback != (TidyMessageCallback)0x0) {
    BVar6 = pTVar8->allowMessage;
    BVar7 = (*pTVar3->messageCallback)((TidyMessage)pTVar8);
    pTVar8->allowMessage = BVar7 & BVar6;
  }
  return pTVar8;
code_r0x0015b8fd:
  pbVar22 = pbVar21 + 1;
  if (pbVar21[-1] == 0x25) goto code_r0x0015b905;
  goto LAB_0015b8f5;
code_r0x0015b905:
  uVar15 = uVar15 + (*pbVar21 != 0x25);
  goto LAB_0015b8f2;
}

Assistant:

static TidyMessageImpl *tidyMessageCreateInitV( TidyDocImpl *doc,
                                                Node *node,
                                                uint code,
                                                int line,
                                                int column,
                                                TidyReportLevel level,
                                                va_list args )
{
    TidyMessageImpl *result = TidyDocAlloc(doc, sizeof(TidyMessageImpl));
    TidyDoc tdoc = tidyImplToDoc(doc);
    va_list args_copy;
    enum { sizeMessageBuf=2048 };
    ctmbstr pattern;
    uint i = 0;


    /* Things we know... */

    result->tidyDoc = doc;
    result->tidyNode = node;
    result->code = code;
    result->line = line;
    result->column = column;
    result->level = level;
    /* Is #719 - set 'muted' before any callbacks. */
    result->muted = no;
    i = 0;
    while ((doc->muted.list) && (doc->muted.list[i] != 0))
    {
        if (doc->muted.list[i] == code)
        {
            result->muted = yes;
            break;
        }
        i++;
    }

    /* Things we create... */

    va_copy(args_copy, args);
    result->arguments = BuildArgArray(doc, tidyDefaultString(code), args_copy, &result->argcount);
    va_end(args_copy);

    result->messageKey = TY_(tidyErrorCodeAsKey)(code);

    result->messageFormatDefault = tidyDefaultString(code);
    result->messageFormat = tidyLocalizedString(code);

    result->messageDefault = TidyDocAlloc(doc, sizeMessageBuf);
    va_copy(args_copy, args);
    TY_(tmbvsnprintf)(result->messageDefault, sizeMessageBuf, result->messageFormatDefault, args_copy);
    va_end(args_copy);

    result->message = TidyDocAlloc(doc, sizeMessageBuf);
    va_copy(args_copy, args);
    TY_(tmbvsnprintf)(result->message, sizeMessageBuf, result->messageFormat, args_copy);
    va_end(args_copy);

    result->messagePosDefault = TidyDocAlloc(doc, sizeMessageBuf);
    result->messagePos = TidyDocAlloc(doc, sizeMessageBuf);

    if ( cfgBool(doc, TidyEmacs) && cfgStr(doc, TidyEmacsFile) )
    {
        /* Change formatting to be parsable by GNU Emacs */
        TY_(tmbsnprintf)(result->messagePosDefault, sizeMessageBuf, "%s:%d:%d: ", cfgStr(doc, TidyEmacsFile), line, column);
        TY_(tmbsnprintf)(result->messagePos, sizeMessageBuf, "%s:%d:%d: ", cfgStr(doc, TidyEmacsFile), line, column);
    }
    else if ( cfgBool(doc, TidyShowFilename) && cfgStr(doc, TidyEmacsFile) )
    {
        /* Include filename in output */
        TY_(tmbsnprintf)(result->messagePosDefault, sizeMessageBuf, tidyDefaultString(FN_LINE_COLUMN_STRING),
            cfgStr(doc, TidyEmacsFile), line, column);
        TY_(tmbsnprintf)(result->messagePos, sizeMessageBuf, tidyLocalizedString(FN_LINE_COLUMN_STRING),
            cfgStr(doc, TidyEmacsFile), line, column);
    }
    else
    {
        /* traditional format */
        TY_(tmbsnprintf)(result->messagePosDefault, sizeMessageBuf, tidyDefaultString(LINE_COLUMN_STRING), line, column);
        TY_(tmbsnprintf)(result->messagePos, sizeMessageBuf, tidyLocalizedString(LINE_COLUMN_STRING), line, column);
    }

    result->messagePrefixDefault = tidyDefaultString(level);

    result->messagePrefix = tidyLocalizedString(level);

    if ( line > 0 && column > 0 )
        pattern = "%s%s%s";      /* pattern if there's location information */
    else
        pattern = "%.0s%s%s";    /* otherwise if there isn't */

    if ( level > TidyFatal )
        pattern = "%.0s%.0s%s";  /* dialog doesn't have pos or prefix */

    result->messageOutputDefault = TidyDocAlloc(doc, sizeMessageBuf);
    TY_(tmbsnprintf)(result->messageOutputDefault, sizeMessageBuf, pattern,
                     result->messagePosDefault, result->messagePrefixDefault,
                     result->messageDefault);

    result->messageOutput = TidyDocAlloc(doc, sizeMessageBuf);
    TY_(tmbsnprintf)(result->messageOutput, sizeMessageBuf, pattern,
                     result->messagePos, result->messagePrefix,
                     result->message);

    if ( ( cfgBool(doc, TidyMuteShow) == yes ) && level <= TidyFatal )
    {
        /*\ Issue #655 - Unsafe to use output buffer as one of the va_list
         *  input parameters in some snprintf implmentations.
        \*/
        ctmbstr pc = TY_(tidyErrorCodeAsKey)(code);
        i = TY_(tmbstrlen)(result->messageOutputDefault);
        if (i < sizeMessageBuf)
            TY_(tmbsnprintf)(result->messageOutputDefault + i, sizeMessageBuf - i, " (%s)", pc );
        i = TY_(tmbstrlen)(result->messageOutput);
        if (i < sizeMessageBuf)
            TY_(tmbsnprintf)(result->messageOutput + i, sizeMessageBuf - i, " (%s)", pc );
        i = 0;
    }

    result->allowMessage = yes;

    /* reportFilter is a simple error filter that provides minimal information
       to callback functions, and includes the message buffer in LibTidy's
       configured localization. As it's a "legacy" API, it does not receive
       TidyDialogue messages.*/
    if ( (result->level <= TidyFatal) && doc->reportFilter )
    {
        result->allowMessage = result->allowMessage & doc->reportFilter( tdoc, result->level, result->line, result->column, result->messageOutput );
    }

    /* reportCallback is intended to allow LibTidy users to localize messages
       via their own means by providing a key and the parameters to fill it. 
       As it's a "legacy" API, it does not receive TidyDialogue messages. */
    if ( (result->level <= TidyFatal) && doc->reportCallback )
    {
        TidyDoc tdoc = tidyImplToDoc( doc );
        va_copy(args_copy, args);
        result->allowMessage = result->allowMessage & doc->reportCallback( tdoc, result->level, result->line, result->column, result->messageKey, args_copy );
        va_end(args_copy);
    }

    /* messageCallback is the newest interface to interrogate Tidy's
       emitted messages. */
    if ( doc->messageCallback )
    {
        result->allowMessage = result->allowMessage & doc->messageCallback( tidyImplToMessage(result) );
    }

    return result;
}